

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso.c
# Opt level: O0

void Gia_IsoSimulate(Gia_IsoMan_t *p,int Iter)

{
  uint uVar1;
  Gia_Man_t *pGVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  Gia_Obj_t *pGVar6;
  bool bVar7;
  int local_2c;
  int iObj;
  int i;
  Gia_Obj_t *pObjF;
  Gia_Obj_t *pObj;
  int Iter_local;
  Gia_IsoMan_t *p_local;
  
  uVar1 = s_256Primes[0xff];
  pGVar6 = Gia_ManConst0(p->pGia);
  pGVar6->Value = uVar1 + pGVar6->Value;
  local_2c = 0;
  while( true ) {
    iVar3 = Gia_ManPiNum(p->pGia);
    bVar7 = false;
    if (local_2c < iVar3) {
      pObjF = Gia_ManCi(p->pGia,local_2c);
      bVar7 = pObjF != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    pObjF->Value = s_256Primes[0xfe] + pObjF->Value;
    local_2c = local_2c + 1;
  }
  if (Iter == 0) {
    local_2c = 0;
    while( true ) {
      iVar3 = Gia_ManRegNum(p->pGia);
      bVar7 = false;
      if (local_2c < iVar3) {
        pGVar2 = p->pGia;
        iVar3 = Gia_ManPiNum(p->pGia);
        pObjF = Gia_ManCi(pGVar2,iVar3 + local_2c);
        bVar7 = pObjF != (Gia_Obj_t *)0x0;
      }
      if (!bVar7) break;
      pObjF->Value = s_256Primes[0xfd] + pObjF->Value;
      local_2c = local_2c + 1;
    }
  }
  local_2c = 0;
  while( true ) {
    bVar7 = false;
    if (local_2c < p->pGia->nObjs) {
      pObjF = Gia_ManObj(p->pGia,local_2c);
      bVar7 = pObjF != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    iVar3 = Gia_ObjIsAnd(pObjF);
    if (iVar3 != 0) {
      pGVar6 = Gia_ObjFanin0(pObjF);
      uVar1 = pGVar6->Value;
      iVar3 = Gia_ObjFaninId0(pObjF,local_2c);
      iVar4 = Gia_ObjFaninC0(pObjF);
      uVar5 = Gia_IsoUpdate(p,Iter,iVar3,iVar4);
      pObjF->Value = uVar1 + uVar5 + pObjF->Value;
      pGVar6 = Gia_ObjFanin1(pObjF);
      uVar1 = pGVar6->Value;
      iVar3 = Gia_ObjFaninId1(pObjF,local_2c);
      iVar4 = Gia_ObjFaninC1(pObjF);
      uVar5 = Gia_IsoUpdate(p,Iter,iVar3,iVar4);
      pObjF->Value = uVar1 + uVar5 + pObjF->Value;
    }
    local_2c = local_2c + 1;
  }
  local_2c = 0;
  while( true ) {
    iVar3 = Vec_IntSize(p->pGia->vCos);
    bVar7 = false;
    if (local_2c < iVar3) {
      pObjF = Gia_ManCo(p->pGia,local_2c);
      bVar7 = pObjF != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    iVar3 = Gia_ObjId(p->pGia,pObjF);
    pGVar6 = Gia_ObjFanin0(pObjF);
    uVar1 = pGVar6->Value;
    iVar3 = Gia_ObjFaninId0(pObjF,iVar3);
    iVar4 = Gia_ObjFaninC0(pObjF);
    uVar5 = Gia_IsoUpdate(p,Iter,iVar3,iVar4);
    pObjF->Value = uVar1 + uVar5 + pObjF->Value;
    local_2c = local_2c + 1;
  }
  local_2c = 0;
  while( true ) {
    iVar3 = Gia_ManRegNum(p->pGia);
    bVar7 = false;
    if (local_2c < iVar3) {
      pGVar2 = p->pGia;
      iVar3 = Gia_ManPoNum(p->pGia);
      _iObj = Gia_ManCo(pGVar2,iVar3 + local_2c);
      bVar7 = false;
      if (_iObj != (Gia_Obj_t *)0x0) {
        pGVar2 = p->pGia;
        iVar3 = Gia_ManPiNum(p->pGia);
        pObjF = Gia_ManCi(pGVar2,iVar3 + local_2c);
        bVar7 = pObjF != (Gia_Obj_t *)0x0;
      }
    }
    if (!bVar7) break;
    pObjF->Value = _iObj->Value + pObjF->Value;
    local_2c = local_2c + 1;
  }
  return;
}

Assistant:

void Gia_IsoSimulate( Gia_IsoMan_t * p, int Iter )
{
    Gia_Obj_t * pObj, * pObjF;
    int i, iObj;
    // initialize constant, inputs, and flops in the first frame
    Gia_ManConst0(p->pGia)->Value += s_256Primes[ISO_MASK];
    Gia_ManForEachPi( p->pGia, pObj, i )
        pObj->Value += s_256Primes[ISO_MASK-1];
    if ( Iter == 0 )
        Gia_ManForEachRo( p->pGia, pObj, i )
            pObj->Value += s_256Primes[ISO_MASK-2];
    // simulate nodes
    Gia_ManForEachAnd( p->pGia, pObj, i )
    {
        pObj->Value += Gia_ObjFanin0(pObj)->Value + Gia_IsoUpdate(p, Iter, Gia_ObjFaninId0(pObj, i), Gia_ObjFaninC0(pObj));
        pObj->Value += Gia_ObjFanin1(pObj)->Value + Gia_IsoUpdate(p, Iter, Gia_ObjFaninId1(pObj, i), Gia_ObjFaninC1(pObj));
    }
    // simulate COs
    Gia_ManForEachCo( p->pGia, pObj, i )
    {
        iObj = Gia_ObjId(p->pGia, pObj);
        pObj->Value += Gia_ObjFanin0(pObj)->Value + Gia_IsoUpdate(p, Iter, Gia_ObjFaninId0(pObj, iObj), Gia_ObjFaninC0(pObj));
    }
    // transfer flop values
    Gia_ManForEachRiRo( p->pGia, pObjF, pObj, i )
        pObj->Value += pObjF->Value;
}